

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

boolean somexy(level *lev,mkroom *croom,coord *c)

{
  char cVar1;
  char cVar2;
  mkroom *pmVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  char cVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  if (croom->irregular == '\0') {
    if (croom->nsubrooms == '\0') {
      cVar7 = croom->hx;
      cVar1 = croom->lx;
      uVar9 = mt_random();
      c->x = SUB161(ZEXT416(uVar9) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + croom->lx;
      cVar7 = croom->hy;
      cVar1 = croom->ly;
      uVar9 = mt_random();
      c->y = SUB161(ZEXT416(uVar9) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + croom->ly;
LAB_001e55a0:
      bVar4 = true;
    }
    else {
      iVar12 = 1;
      iVar13 = 0;
      do {
        iVar6 = iVar12;
        cVar7 = croom->hx;
        cVar1 = croom->lx;
        uVar9 = mt_random();
        c->x = SUB161(ZEXT416(uVar9) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + croom->lx;
        cVar7 = croom->hy;
        cVar1 = croom->ly;
        uVar9 = mt_random();
        cVar8 = SUB161(ZEXT416(uVar9) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + croom->ly;
        c->y = cVar8;
        cVar7 = c->x;
        cVar1 = lev->locations[cVar7][cVar8].typ;
        if ('\f' < cVar1 || cVar1 == '\0') {
          if ((long)croom->nsubrooms < 1) goto LAB_001e54fa;
          lVar11 = 0;
          while ((((pmVar3 = croom->sbrooms[lVar11], cVar7 + 1 < (int)pmVar3->lx ||
                   ((int)pmVar3->hx < cVar7 + -1)) || (cVar8 + 1 < (int)pmVar3->ly)) ||
                 ((int)pmVar3->hy < cVar8 + -1))) {
            lVar11 = lVar11 + 1;
            if (croom->nsubrooms == lVar11) goto LAB_001e54fa;
          }
        }
        iVar12 = iVar6 + 1;
        iVar13 = iVar6;
      } while (iVar12 != 0x65);
      iVar13 = 100;
LAB_001e54fa:
      bVar4 = iVar13 < 99;
    }
  }
  else {
    uVar9 = (int)((ulong)((long)croom + (-0xb960 - (long)lev)) >> 3) * 0x684bda13 + 3;
    iVar12 = 100;
    do {
      cVar7 = croom->hx;
      cVar1 = croom->lx;
      uVar5 = mt_random();
      c->x = SUB161(ZEXT416(uVar5) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + croom->lx;
      cVar7 = croom->hy;
      cVar1 = croom->ly;
      uVar5 = mt_random();
      cVar8 = croom->ly;
      cVar7 = SUB161(ZEXT416(uVar5) % SEXT816(((long)cVar7 - (long)cVar1) + 1),0) + cVar8;
      c->y = cVar7;
      uVar5 = *(uint *)&lev->locations[c->x][cVar7].field_0x6;
      if (((uVar5 >> 0x16 & 1) == 0) && ((uVar5 >> 0x10 & 0x3f) == uVar9)) goto LAB_001e55a0;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    cVar7 = croom->lx;
    cVar1 = croom->hx;
    c->x = cVar7;
    if (cVar7 <= cVar1) {
      cVar2 = croom->hy;
      do {
        c->y = cVar8;
        if (cVar8 <= cVar2) {
          cVar10 = cVar8;
          do {
            uVar5 = *(uint *)&lev->locations[cVar7][cVar10].field_0x6;
            if (((uVar5 >> 0x16 & 1) == 0) && ((uVar5 >> 0x10 & 0x3f) == uVar9)) goto LAB_001e55a0;
            cVar10 = cVar10 + '\x01';
            c->y = cVar10;
          } while (cVar10 <= cVar2);
        }
        cVar7 = cVar7 + '\x01';
        c->x = cVar7;
      } while (cVar7 <= cVar1);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

boolean somexy(struct level *lev, struct mkroom *croom, coord *c)
{
	int try_cnt = 0;
	int i;

	if (croom->irregular) {
	    i = (croom - lev->rooms) + ROOMOFFSET;

	    while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (!lev->locations[c->x][c->y].edge &&
			(int) lev->locations[c->x][c->y].roomno == i)
		    return TRUE;
	    }
	    /* try harder; exhaustively search until one is found */
	    for (c->x = croom->lx; c->x <= croom->hx; c->x++)
		for (c->y = croom->ly; c->y <= croom->hy; c->y++)
		    if (!lev->locations[c->x][c->y].edge &&
			    (int) lev->locations[c->x][c->y].roomno == i)
			return TRUE;
	    return FALSE;
	}

	if (!croom->nsubrooms) {
		c->x = somex(croom);
		c->y = somey(croom);
		return TRUE;
	}

	/* Check that coords doesn't fall into a subroom or into a wall */

	while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (IS_WALL(lev->locations[c->x][c->y].typ))
		    continue;
		for (i=0; i < croom->nsubrooms; i++)
		    if (inside_room(croom->sbrooms[i], c->x, c->y))
			goto you_lose;
		break;
you_lose:	;
	}
	if (try_cnt >= 100)
	    return FALSE;
	return TRUE;
}